

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O0

void NULLCVector::VectorPushBack(NULLCRef val,vector *vec)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  NULLCArray NVar4;
  char **local_68;
  uint local_54;
  uint local_44;
  char *local_30;
  uint local_28;
  NULLCArray newData;
  uint newSize;
  vector *vec_local;
  
  uVar1 = val.typeID;
  if (vec->flags == 0) {
    local_44 = vec->elemType;
  }
  else {
    local_44 = nullcGetSubType(vec->elemType);
  }
  if (uVar1 == local_44) {
    if (vec->size == (vec->data).len) {
      if ((vec->data).len < 0x20) {
        local_54 = 0x20;
      }
      else {
        local_54 = (vec->data).len * 2 + (vec->data).len;
      }
      NVar4 = nullcAllocateArrayTyped((vec->data).typeID,local_54);
      local_30 = NVar4.ptr;
      local_28 = NVar4.len;
      if (local_30 == (char *)0x0) {
        return;
      }
      if ((vec->data).len != 0) {
        memcpy(local_30,(vec->data).ptr,(ulong)(vec->elemSize * (vec->data).len));
      }
      (vec->data).ptr = local_30;
      (vec->data).len = local_28;
    }
    if (vec->flags == 0) {
      local_68 = (char **)val.ptr;
    }
    else {
      local_68 = &val.ptr;
    }
    memcpy((vec->data).ptr + vec->elemSize * vec->size,local_68,(ulong)vec->elemSize);
    vec->size = vec->size + 1;
  }
  else {
    pcVar2 = nullcGetTypeName(val.typeID);
    pcVar3 = nullcGetTypeName(vec->elemType);
    nullcThrowError("vector::push_back received value (%s) that is different from vector type (%s)",
                    pcVar2,pcVar3);
  }
  return;
}

Assistant:

void VectorPushBack(NULLCRef val, vector* vec)
	{
		// Check that we received type that is equal to array element type
		if(val.typeID != (vec->flags ? nullcGetSubType(vec->elemType) : vec->elemType))
		{
			nullcThrowError("vector::push_back received value (%s) that is different from vector type (%s)", nullcGetTypeName(val.typeID), nullcGetTypeName(vec->elemType));
			return;
		}
		// If not enough space
		if(vec->size == vec->data.len)
		{
			// Allocate new
			unsigned int newSize = 32 > vec->data.len ? 32 : (vec->data.len << 1) + vec->data.len;

			NULLCArray newData = nullcAllocateArrayTyped(vec->data.typeID, newSize);

			if(!newData.ptr)
				return;

			if(vec->data.len)
				memcpy(newData.ptr, vec->data.ptr, unsigned(vec->elemSize * vec->data.len));

			vec->data.ptr = newData.ptr;
			vec->data.len = newData.len;
		}
		memcpy(vec->data.ptr + vec->elemSize * vec->size, vec->flags ? (char*)&val.ptr : val.ptr, vec->elemSize);
		vec->size++;
	}